

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O3

void __thiscall
qclab::qgates::RotationY<std::complex<float>_>::apply
          (RotationY<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  float fVar1;
  int iVar2;
  float c;
  anon_class_24_4_61ab1aa0_conflict f;
  anon_class_24_4_61ab1aa0_conflict local_40;
  
  iVar2 = (*(this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  local_40.c = (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_;
  fVar1 = (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_;
  local_40.vector =
       (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_40.s1 = -fVar1;
  local_40.s2 = fVar1;
  if (op != NoTrans) {
    local_40.s2 = local_40.s1;
    local_40.s1 = fVar1;
  }
  apply2<qclab::qgates::lambda_RotationY<std::complex<float>,float>(qclab::Op,float,float,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar2 + offset,&local_40);
  return;
}

Assistant:

void RotationY< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationY( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }